

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_address.cpp
# Opt level: O1

int CfdInitializeMultisigScript(void *handle,int network_type,int hash_type,void **multisig_handle)

{
  AddressType AVar1;
  void *pvVar2;
  CfdException *pCVar3;
  undefined1 local_50 [32];
  
  cfd::Initialize();
  if (multisig_handle == (void **)0x0) {
    local_50._0_8_ = "cfdcapi_address.cpp";
    local_50._8_4_ = 0xdc;
    local_50._16_8_ = "CfdInitializeMultisigScript";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_50,kCfdLogLevelWarning,"multisig handle is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_50._0_8_ = local_50 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"Failed to parameter. multisig handle is null.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_50);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  cfd::capi::ConvertNetType(network_type,(bool *)0x0);
  AVar1 = cfd::capi::ConvertHashToAddressType(0);
  if ((AVar1 < kP2shP2wpkhAddress) && ((0x2aU >> (AVar1 & 0x1f) & 1) != 0)) {
    local_50._0_8_ = local_50 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"MultisigScript","");
    pvVar2 = cfd::capi::AllocBuffer((string *)local_50,0xa58);
    *multisig_handle = pvVar2;
    if ((undefined1 *)local_50._0_8_ != local_50 + 0x10) {
      operator_delete((void *)local_50._0_8_);
    }
    pvVar2 = *multisig_handle;
    *(int *)((long)pvVar2 + 0x10) = network_type;
    *(int *)((long)pvVar2 + 0x14) = hash_type;
    return 0;
  }
  local_50._0_8_ = "cfdcapi_address.cpp";
  local_50._8_4_ = 0xe9;
  local_50._16_8_ = "CfdInitializeMultisigScript";
  cfd::core::logger::log<>((CfdSourceLocation *)local_50,kCfdLogLevelWarning,"pkh is not target.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  local_50._0_8_ = local_50 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"Failed to parameter. hash type cannot used pkh target.","");
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_50);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdInitializeMultisigScript(
    void* handle, int network_type, int hash_type, void** multisig_handle) {
  try {
    cfd::Initialize();
    if (multisig_handle == nullptr) {
      warn(CFD_LOG_SOURCE, "multisig handle is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. multisig handle is null.");
    }
    cfd::capi::ConvertNetType(network_type, nullptr);
    AddressType addr_type = ConvertHashToAddressType(hash_type);
    switch (addr_type) {
      case AddressType::kP2shAddress:
      case AddressType::kP2wshAddress:
      case AddressType::kP2shP2wshAddress:
        break;
      default:
        warn(CFD_LOG_SOURCE, "pkh is not target.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. hash type cannot used pkh target.");
    }

    *multisig_handle =
        AllocBuffer(kPrefixMultisigScript, sizeof(CfdCapiMultisigScript));
    CfdCapiMultisigScript* data =
        static_cast<CfdCapiMultisigScript*>(*multisig_handle);
    data->network_type = network_type;
    data->hash_type = hash_type;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}